

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_get(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_buffer_t *piVar1;
  int iVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_address_t adr;
  ion_bpp_key_t *mkey;
  ion_bpp_external_address_t *local_40;
  ion_bpp_buffer_t *buf;
  
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  local_40 = rec;
  do {
    piVar1 = buf;
    if ((undefined1  [40])((undefined1  [40])*buf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      iVar2 = search(handle,buf,key,0,&mkey,MODE_FIRST);
      if (iVar2 != 0) {
        return bErrKeyNotFound;
      }
      *local_40 = *(ion_bpp_external_address_t *)(mkey + *(int *)((long)handle + 8));
      *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar1;
      *(ion_bpp_key_t **)((long)handle + 0xb0) = mkey;
      return bErrOk;
    }
    iVar2 = search(handle,buf,key,0,&mkey,MODE_MATCH);
    if (iVar2 < 0) {
      adr = *(ion_bpp_address_t *)(mkey + -8);
    }
    else {
      adr = *(ion_bpp_address_t *)(mkey + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar3 = readDisk(handle,adr,&buf);
  } while (iVar3 == bErrOk);
  return iVar3;
}

Assistant:

ion_bpp_err_t
b_get(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*mkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if (search(handle, buf, key, 0, &mkey, MODE_FIRST) == 0) {
				*rec		= rec(mkey);
				h->curBuf	= buf;
				h->curKey	= mkey;
				return bErrOk;
			}
			else {
				return bErrKeyNotFound;
			}
		}
		else {
			if (search(handle, buf, key, 0, &mkey, MODE_MATCH) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}